

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<float>::InsertNode(BpTree<float> *this,IndexNode<float> *Node)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  IndexNode<float> local_b0;
  string local_40 [40];
  Addr p;
  IndexNode<float> *Node_local;
  BpTree<float> *this_local;
  
  p = (Addr)Node;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->FileOff_bin);
  if (bVar1) {
    iVar2 = this->Current_Off + 1;
    this->Current_Off = iVar2;
    *(int *)((long)p + 0x5c) = iVar2;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->FileOff_bin);
    *(value_type *)((long)p + 0x5c) = *pvVar3;
    std::vector<int,_std::allocator<int>_>::pop_back(&this->FileOff_bin);
  }
  std::__cxx11::string::string(local_40,(string *)&this->Index_FileName);
  iVar2 = Buffer::Allocate(&blocks,(string *)local_40,*(int *)((long)p + 0x5c));
  *(int *)((long)p + 0x58) = iVar2;
  std::__cxx11::string::~string(local_40);
  IndexNode<float>::IndexNode(&local_b0,(IndexNode<float> *)p);
  Node2Block(this,&local_b0);
  IndexNode<float>::~IndexNode(&local_b0);
  return;
}

Assistant:

void BpTree<K>::InsertNode(IndexNode<K>& Node) {
	Addr p;
	if (this->FileOff_bin.empty()) {
		Node.self.FileOff = ++this->Current_Off;
	}
	else{
		Node.self.FileOff = this->FileOff_bin.back();
		this->FileOff_bin.pop_back();
	}
	Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);	//Ϊ�ý������buffer�е�һ���ڴ棬��Ŵ���Block_Num��,������
	this->Node2Block(Node);															//�������Ϣ����鵱��
}